

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O0

bool cmExecProgramCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  const_reference pvVar5;
  size_type sVar6;
  char *dir;
  long lVar7;
  cmMakefile *pcVar8;
  string_view local_2d8;
  char local_2c8 [8];
  char buffer [100];
  string local_248 [8];
  string coutput;
  size_type last;
  size_type first;
  string local_1f8;
  Status local_1d4;
  byte local_1c9;
  undefined1 local_1c8 [7];
  bool result;
  string output;
  int retVal;
  bool verbose;
  string local_180;
  string local_160 [8];
  string command;
  string local_138;
  undefined4 local_118;
  allocator<char> local_111;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_c8 [7];
  bool havereturn_variable;
  string return_variable;
  undefined1 local_a0 [7];
  bool haveoutput_variable;
  string output_variable;
  int count;
  bool doingargs;
  string arguments;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&count);
    output_variable.field_2._M_local_buf[0xf] = '\0';
    output_variable.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_a0);
    return_variable.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_c8);
    pcVar1 = status_local;
    bVar2 = false;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pcVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar3) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      bVar3 = std::operator==(local_f0,"OUTPUT_VARIABLE");
      if (bVar3) {
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        output_variable.field_2._M_local_buf[0xf] = '\0';
        bVar2 = false;
        return_variable.field_2._M_local_buf[0xf] = '\x01';
      }
      else if ((return_variable.field_2._M_local_buf[0xf] & 1U) == 0) {
        bVar3 = std::operator==(local_f0,"RETURN_VALUE");
        if (bVar3) {
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          output_variable.field_2._M_local_buf[0xf] = '\0';
          return_variable.field_2._M_local_buf[0xf] = '\0';
          bVar2 = true;
        }
        else if (bVar2) {
          uVar4 = std::__cxx11::string::empty();
          pcVar1 = local_20;
          if ((uVar4 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"called with incorrect number of arguments",
                       (allocator<char> *)(command.field_2._M_local_buf + 0xf));
            cmExecutionStatus::SetError(pcVar1,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(command.field_2._M_local_buf + 0xf));
            args_local._7_1_ = 0;
            local_118 = 1;
            goto LAB_002ce41c;
          }
          std::__cxx11::string::operator=((string *)local_c8,(string *)local_f0);
          bVar2 = false;
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        }
        else {
          bVar3 = std::operator==(local_f0,"ARGS");
          if (bVar3) {
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
            bVar2 = false;
            return_variable.field_2._M_local_buf[0xf] = '\0';
            output_variable.field_2._M_local_buf[0xf] = '\x01';
          }
          else if ((output_variable.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::__cxx11::string::operator+=((string *)&count,(string *)local_f0);
            std::__cxx11::string::operator+=((string *)&count," ");
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          }
        }
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"called with incorrect number of arguments",&local_111);
          cmExecutionStatus::SetError(pcVar1,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator(&local_111);
          args_local._7_1_ = 0;
          local_118 = 1;
          goto LAB_002ce41c;
        }
        std::__cxx11::string::operator=((string *)local_a0,(string *)local_f0);
        return_variable.field_2._M_local_buf[0xf] = '\0';
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::string(local_160);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      cmSystemTools::ConvertToRunCommandPath((string *)&retVal,pvVar5);
      output.field_2._M_local_buf[0xf] = ' ';
      cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                (&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retVal,
                 output.field_2._M_local_buf + 0xf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count);
      std::__cxx11::string::operator=(local_160,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&retVal);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      std::__cxx11::string::operator=(local_160,(string *)pvVar5);
    }
    output.field_2._M_local_buf[0xe] = '\x01';
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      output.field_2._M_local_buf[0xe] = '\0';
    }
    output.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_1c8);
    local_1c9 = 1;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar6 - (long)(int)output_variable.field_2._8_4_ == 2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      local_1d4 = cmsys::SystemTools::MakeDirectory(pvVar5,(mode_t *)0x0);
      std::__cxx11::string::string((string *)&local_1f8,local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,1);
      dir = (char *)std::__cxx11::string::c_str();
      local_1c9 = anon_unknown.dwarf_2e6104::RunCommand
                            (&local_1f8,(string *)local_1c8,(int *)(output.field_2._M_local_buf + 8)
                             ,dir,(bool)(output.field_2._M_local_buf[0xe] & 1),Auto);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    else {
      std::__cxx11::string::string((string *)&first,local_160);
      local_1c9 = anon_unknown.dwarf_2e6104::RunCommand
                            ((string *)&first,(string *)local_1c8,
                             (int *)(output.field_2._M_local_buf + 8),(char *)0x0,
                             (bool)(output.field_2._M_local_buf[0xe] & 1),Auto);
      std::__cxx11::string::~string((string *)&first);
    }
    if ((local_1c9 & 1) == 0) {
      output.field_2._8_4_ = 0xffffffff;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      last = std::__cxx11::string::find_first_not_of(local_1c8,0xfa2fa5);
      coutput.field_2._8_8_ = std::__cxx11::string::find_last_not_of(local_1c8,0xfa2fa5);
      if (last == 0xffffffffffffffff) {
        last = 0;
      }
      if (coutput.field_2._8_8_ == -1) {
        lVar7 = std::__cxx11::string::size();
        coutput.field_2._8_8_ = lVar7 + -1;
      }
      std::__cxx11::string::string
                (local_248,(string *)local_1c8,last,(coutput.field_2._8_8_ - last) + 1);
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_248);
      cmMakefile::AddDefinition(pcVar8,(string *)local_a0,value);
      std::__cxx11::string::~string(local_248);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      snprintf(local_2c8,100,"%d",(ulong)(uint)output.field_2._8_4_);
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,local_2c8)
      ;
      cmMakefile::AddDefinition(pcVar8,(string *)local_c8,local_2d8);
    }
    args_local._7_1_ = 1;
    local_118 = 1;
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_160);
LAB_002ce41c:
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&count);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmExecProgramCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmStrCat(cmSystemTools::ConvertToRunCommandPath(args[0]), ' ',
                       arguments);
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = RunCommand(command, output, retVal, args[1].c_str(), verbose);
  } else {
    result = RunCommand(command, output, retVal, nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    status.GetMakefile().AddDefinition(output_variable, coutput);
  }

  if (!return_variable.empty()) {
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%d", retVal);
    status.GetMakefile().AddDefinition(return_variable, buffer);
  }

  return true;
}